

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O1

void __thiscall TPZMHMixedMeshControl::DeletePressureElements(TPZMHMixedMeshControl *this)

{
  long lVar1;
  TPZCompEl **ppTVar2;
  long nelem;
  
  TPZGeoMesh::ResetReference(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer);
  lVar1 = (((this->super_TPZMHMeshControl).fPressureFineMesh.fRef)->fPointer->fElementVec).
          super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  if (0 < lVar1) {
    nelem = 0;
    do {
      ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(((this->super_TPZMHMeshControl).fPressureFineMesh.fRef)->fPointer->
                            fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
      if (*ppTVar2 != (TPZCompEl *)0x0) {
        (**(code **)(*(long *)*ppTVar2 + 8))();
      }
      nelem = nelem + 1;
    } while (lVar1 != nelem);
  }
  return;
}

Assistant:

void TPZMHMixedMeshControl::DeletePressureElements()
{
    fGMesh->ResetReference();
    int64_t nel = fPressureFineMesh->NElements();
    for (int64_t el=0; el<nel; el++) {
        TPZCompEl *cel = fPressureFineMesh->Element(el);
        if (cel) {
            delete cel;
        }
    }
}